

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void ltsqueeze(size_t padsz)

{
  FreeBlock *pFVar1;
  Chunk *pCVar2;
  Chunk *pCVar3;
  FreeBlock **ppFVar4;
  ushort uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  bool local_80e2;
  unsigned_short **local_80d8;
  Chunk *nextFreeChunk;
  Chunk **c;
  Chunk *first;
  FreeBlock *nextBatch;
  uint batchSize;
  uint additionalBlocksListSize;
  FreeBlock **ablock;
  FreeBlock **abatch;
  FreeBlock *additionalBlocksList;
  FreeBlock *additionalBatchesList;
  Chunk *chunk_1;
  Chunk *chunk;
  Chunk *firstFreeChunk;
  FreeBlock **pblock;
  FreeBlock *block;
  FreeBlock **pbatch;
  unsigned_short **ppuStack_8050;
  uint numBlocksInChunk;
  unsigned_short *inChunkFreeBlocks;
  char buffer [32768];
  FreeBlock *freeList;
  FreeBlock *firstBatch;
  ulong uStack_30;
  uint freeListSize;
  size_t bufferSize;
  uintptr_t minChunkAddr;
  CentralCache *cc;
  size_t sStack_10;
  uint sizeClass;
  size_t padsz_local;
  
  sStack_10 = padsz;
  cc._4_4_ = get_size_class(0x10);
  do {
    if (0x103 < cc._4_4_) {
      return;
    }
    uVar8 = (ulong)cc._4_4_;
    minChunkAddr = (uintptr_t)(centralCache + uVar8);
    if (0x10000 < centralCache[uVar8].maxChunkAddr - centralCache[uVar8].minChunkAddr) {
      spinlock_acquire((int *)minChunkAddr);
      if ((ulong)(*(long *)(minChunkAddr + 0x30) - *(long *)(minChunkAddr + 0x28)) < 0x10001) {
        *(undefined4 *)minChunkAddr = 0;
      }
      else {
        bufferSize = *(size_t *)(minChunkAddr + 0x28);
        uStack_30 = (*(long *)(minChunkAddr + 0x30) - bufferSize >> 0x10) * 2 + 2;
        firstBatch._4_4_ = *(int *)(minChunkAddr + 0x20);
        freeList = *(FreeBlock **)(minChunkAddr + 0x10);
        buffer._32760_8_ = *(undefined8 *)(minChunkAddr + 0x18);
        *(undefined8 *)(minChunkAddr + 0x10) = 0;
        *(undefined8 *)(minChunkAddr + 0x18) = 0;
        *(undefined4 *)(minChunkAddr + 0x20) = 0;
        *(undefined4 *)minChunkAddr = 0;
        if (uStack_30 < 0x8001) {
          local_80d8 = &inChunkFreeBlocks;
          memset(local_80d8,0,uStack_30);
        }
        else {
          pvVar7 = mmap((void *)0x0,uStack_30,3,0x22,-1,0);
          local_80d8 = (unsigned_short **)((long)pvVar7 + 1U & 0xfffffffffffffffe);
        }
        ppuStack_8050 = local_80d8;
        uVar6 = class_to_size(cc._4_4_);
        pbatch._4_4_ = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xffc0)) / ZEXT416(uVar6),0);
        chunk = (Chunk *)0x0;
        if (0xffff < pbatch._4_4_) {
          __assert_fail("numBlocksInChunk < (1U << (sizeof(short) * 8))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x47c,"void ltsqueeze(size_t)");
        }
        if (ppuStack_8050 == (unsigned_short **)0x0) {
          for (block = (FreeBlock *)&freeList; block->next != (FreeBlock *)0x0;
              block = (FreeBlock *)&block->next->nextBatch) {
          }
          for (firstFreeChunk = (Chunk *)(buffer + 0x7ff8); *(long *)firstFreeChunk != 0;
              firstFreeChunk = *(Chunk **)firstFreeChunk) {
          }
        }
        else {
          for (block = (FreeBlock *)&freeList; block->next != (FreeBlock *)0x0;
              block = (FreeBlock *)&block->next->nextBatch) {
            for (pblock = &block->next->next; pblock != (FreeBlock **)0x0; pblock = &(*pblock)->next
                ) {
              uVar8 = (long)pblock - bufferSize >> 0x10;
              uVar5 = *(short *)((long)ppuStack_8050 + uVar8 * 2) + 1;
              *(ushort *)((long)ppuStack_8050 + uVar8 * 2) = uVar5;
              if (uVar5 == pbatch._4_4_) {
                chunk_1 = (Chunk *)((ulong)pblock & 0xffffffffffff0000);
                if (chunk_1->sizeClass != cc._4_4_) {
                  __assert_fail("chunk->sizeClass == sizeClass",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                                ,0x489,"void ltsqueeze(size_t)");
                }
                *(Chunk **)chunk_1 = chunk;
                chunk = chunk_1;
              }
            }
          }
          for (firstFreeChunk = (Chunk *)(buffer + 0x7ff8); *(long *)firstFreeChunk != 0;
              firstFreeChunk = *(Chunk **)firstFreeChunk) {
            uVar8 = *(long *)firstFreeChunk - bufferSize >> 0x10;
            uVar5 = *(short *)((long)ppuStack_8050 + uVar8 * 2) + 1;
            *(ushort *)((long)ppuStack_8050 + uVar8 * 2) = uVar5;
            if (uVar5 == pbatch._4_4_) {
              additionalBatchesList = (FreeBlock *)(*(ulong *)firstFreeChunk & 0xffffffffffff0000);
              if (*(uint *)&additionalBatchesList->next != cc._4_4_) {
                __assert_fail("chunk->sizeClass == sizeClass",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                              ,0x48b,"void ltsqueeze(size_t)");
              }
              additionalBatchesList->next = (FreeBlock *)chunk;
              chunk = (Chunk *)additionalBatchesList;
            }
          }
        }
        if (chunk != (Chunk *)0x0) {
          additionalBlocksList = (FreeBlock *)0x0;
          abatch = (FreeBlock **)0x0;
          ablock = &additionalBlocksList;
          _batchSize = (Chunk *)&abatch;
          nextBatch._4_4_ = 0;
          uVar6 = batch_size(cc._4_4_);
          block = (FreeBlock *)&freeList;
LAB_00187408:
          for (; block->next != (FreeBlock *)0x0; block = (FreeBlock *)&block->next->nextBatch) {
            for (pblock = &block->next->next; pblock != (FreeBlock **)0x0; pblock = &(*pblock)->next
                ) {
              if (*(ushort *)((long)ppuStack_8050 + ((long)pblock - bufferSize >> 0x10) * 2) ==
                  pbatch._4_4_) {
                pFVar1 = block->next->nextBatch;
                pblock = &block->next->next;
                goto LAB_00187484;
              }
            }
          }
          pblock = (FreeBlock **)buffer._32760_8_;
          while (ppFVar4 = pblock, pblock != (FreeBlock **)0x0) {
            if (*(ushort *)((long)ppuStack_8050 + ((long)pblock - bufferSize >> 0x10) * 2) ==
                pbatch._4_4_) {
              pblock = &(*pblock)->next;
            }
            else {
              *(FreeBlock ***)_batchSize = pblock;
              _batchSize = (Chunk *)ppFVar4;
              pblock = &(*pblock)->next;
              *ppFVar4 = (FreeBlock *)0x0;
              nextBatch._4_4_ = nextBatch._4_4_ + 1;
              if (nextBatch._4_4_ == uVar6 + 1) {
                *ablock = (FreeBlock *)abatch;
                ablock = abatch + 1;
                *ablock = (FreeBlock *)0x0;
                _batchSize = (Chunk *)&abatch;
                abatch = (FreeBlock **)0x0;
                nextBatch._4_4_ = 0;
              }
            }
          }
          *ablock = block->next;
          block->next = additionalBlocksList;
          firstFreeChunk = _batchSize;
          buffer._32760_8_ = abatch;
          firstBatch._4_4_ = nextBatch._4_4_;
          spinlock_acquire((int *)minChunkAddr);
          block->next = *(FreeBlock **)(minChunkAddr + 0x10);
          *(FreeBlock **)(minChunkAddr + 0x10) = freeList;
          *(undefined8 *)firstFreeChunk = *(undefined8 *)(minChunkAddr + 0x18);
          *(undefined8 *)(minChunkAddr + 0x18) = buffer._32760_8_;
          *(int *)(minChunkAddr + 0x20) = *(int *)(minChunkAddr + 0x20) + firstBatch._4_4_;
          *(undefined4 *)minChunkAddr = 0;
          if (0x8000 < uStack_30) {
            munmap(ppuStack_8050,uStack_30);
          }
          if (sStack_10 != 0) {
            spinlock_acquire(&pad.lock);
            pCVar3 = chunk;
            pCVar2 = chunk;
            if (pad.size < sStack_10) {
              do {
                chunk = pCVar2;
                pCVar2 = *(Chunk **)chunk;
                pad.size = pad.size + 0x10000;
                local_80e2 = pad.size < sStack_10 && pCVar2 != (Chunk *)0x0;
              } while (local_80e2);
              *(void **)chunk = pad.freeChunk;
              pad.freeChunk = pCVar3;
              chunk = pCVar2;
            }
            pad.lock = 0;
          }
          while (chunk != (Chunk *)0x0) {
            pCVar2 = *(Chunk **)chunk;
            munmap(chunk,0x10000);
            chunk = pCVar2;
          }
          goto LAB_00187941;
        }
        spinlock_acquire((int *)minChunkAddr);
        block->next = *(FreeBlock **)(minChunkAddr + 0x10);
        *(FreeBlock **)(minChunkAddr + 0x10) = freeList;
        *(undefined8 *)firstFreeChunk = *(undefined8 *)(minChunkAddr + 0x18);
        *(undefined8 *)(minChunkAddr + 0x18) = buffer._32760_8_;
        *(int *)(minChunkAddr + 0x20) = *(int *)(minChunkAddr + 0x20) + firstBatch._4_4_;
        *(undefined4 *)minChunkAddr = 0;
        if (0x8000 < uStack_30) {
          munmap(ppuStack_8050,uStack_30);
        }
      }
    }
LAB_00187941:
    cc._4_4_ = cc._4_4_ + 1;
  } while( true );
LAB_00187484:
  if (pblock != (FreeBlock **)0x0) {
    if (*(ushort *)((long)ppuStack_8050 + ((long)pblock - bufferSize >> 0x10) * 2) == pbatch._4_4_)
    {
      pblock = &(*pblock)->next;
    }
    else {
      *(FreeBlock ***)_batchSize = pblock;
      do {
        ppFVar4 = pblock;
        _batchSize = (Chunk *)pblock;
        pblock = &(*pblock)->next;
        nextBatch._4_4_ = nextBatch._4_4_ + 1;
        if (nextBatch._4_4_ == uVar6 + 1) {
          *ablock = (FreeBlock *)abatch;
          ablock = abatch + 1;
          *ablock = (FreeBlock *)0x0;
          *ppFVar4 = (FreeBlock *)0x0;
          _batchSize = (Chunk *)&abatch;
          abatch = (FreeBlock **)0x0;
          nextBatch._4_4_ = 0;
          break;
        }
        bVar9 = false;
        if ((FreeBlock *)pblock != (FreeBlock *)0x0) {
          bVar9 = *(ushort *)((long)ppuStack_8050 + ((long)pblock - bufferSize >> 0x10) * 2) !=
                  pbatch._4_4_;
        }
      } while (bVar9);
    }
    goto LAB_00187484;
  }
  *(FreeBlock ***)_batchSize = (FreeBlock **)0x0;
  block->next = pFVar1;
  goto LAB_00187408;
}

Assistant:

void ltsqueeze(size_t padsz)
{
	unsigned int sizeClass = get_size_class(2 * sizeof(void*));//skip small chunks because corresponding batches can not be efficiently detached from the central cache (if that becomes relevant, may be it worths to reimplement batches for small chunks from array to linked lists)
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		CentralCache* cc = &centralCache[sizeClass];
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE)//preliminary check without lock (assume that writing to minChunkAddr/maxChunkAddr is atomic)
			continue;

		SPINLOCK_ACQUIRE(&cc->lock);
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE) {//quick check for theoretical possibility that at least one chunk is totally free
			SPINLOCK_RELEASE(&cc->lock);
			continue;
		}
		{uintptr_t minChunkAddr = cc->minChunkAddr;
		size_t bufferSize = ((cc->maxChunkAddr - minChunkAddr) / CHUNK_SIZE + 1) * sizeof(short);
		//Quickly detach all batches of the current size class from the central cache
		unsigned int freeListSize = cc->freeListSize;
		FreeBlock* firstBatch = cc->firstBatch, * freeList = cc->freeList;
		cc->firstBatch = NULL;
		cc->freeList = NULL;
		cc->freeListSize = 0;
		SPINLOCK_RELEASE(&cc->lock);

		//1. Find out chunks with only free blocks via a simple counting the number of free blocks in each chunk
		{char buffer[32 * 1024];//enough for 1GB address space
		unsigned short* inChunkFreeBlocks = (unsigned short*)(bufferSize <= sizeof(buffer) ? memset(buffer, 0, bufferSize) : LTALLOC_VMALLOC(bufferSize));
		unsigned int numBlocksInChunk = (CHUNK_SIZE - (/*CHUNK_IS_SMALL ? sizeof(ChunkSm) : */sizeof(Chunk))) / class_to_size(sizeClass);
		FreeBlock** pbatch, * block, ** pblock;
		Chunk* firstFreeChunk = NULL;
		LTALLOC_ASSERT(numBlocksInChunk < (1U << (sizeof(short) * 8)));//in case if CHUNK_SIZE is too big that total count of blocks in it doesn't fit at short type (...may be use static_assert instead?)
		if (inChunkFreeBlocks)//consider VMALLOC can fail
		{
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch)
				for (block = *pbatch; block; block = block->next)
#define FREE_BLOCK(block) \
					if (++inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)/*chunk is totally free*/\
					{\
						Chunk *chunk = (Chunk*)((uintptr_t)block & ~(CHUNK_SIZE-1));\
						LTALLOC_ASSERT(chunk->sizeClass == sizeClass);/*just in case check before overwriting this info*/\
						*(Chunk**)chunk = firstFreeChunk;/*put nextFreeChunk pointer right at the beginning of Chunk as there are always must be a space for one pointer before first memory block*/\
						firstFreeChunk = chunk;\
					}
					FREE_BLOCK(block)
					for (pblock = &freeList; *pblock; pblock = &(*pblock)->next)
						FREE_BLOCK(*pblock)
#undef FREE_BLOCK
		}
		else {
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch);
			for (pblock = &freeList; *pblock; pblock = &(*pblock)->next);
		}

		if (firstFreeChunk)//is anything to release
		{
			//2. Unlink all matching blocks from the corresponding free lists
			FreeBlock* additionalBatchesList = NULL, * additionalBlocksList = NULL, ** abatch = &additionalBatchesList, ** ablock = &additionalBlocksList;
			unsigned int additionalBlocksListSize = 0, batchSize = batch_size(sizeClass) + 1;
			for (pbatch = &firstBatch; *pbatch;)
			{
				for (block = *pbatch; block; block = block->next)
					if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)//if at least one block belongs to a releasable chunk, then this batch should be handled specially
					{
						FreeBlock* nextBatch = (*pbatch)->nextBatch;
						for (block = *pbatch; block;)//re-add blocks of not-for-release chunks and organize them into another batches' list (to join it with the main later)
							if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)//skip matching-for-release blocks
							{
								*ablock = block;
								do//this loop needed only to minimize memory write operations, otherwise a simpler approach could be used (like in the next loop below)
								{
									ablock = &block->next;
									block = block->next;
									if (++additionalBlocksListSize == batchSize)
									{
										abatch = &(*abatch = additionalBlocksList)->nextBatch;
										*abatch = NULL;
										*ablock = NULL;
										ablock = &additionalBlocksList;
										additionalBlocksList = NULL;
										additionalBlocksListSize = 0;
										break;//to force *ablock = block; for starting a new batch
									}
								} while (block && inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk);
							}
							else
								block = block->next;
						*ablock = NULL;
						*pbatch = nextBatch;//unlink batch
						goto continue_;
					}
				pbatch = &(*pbatch)->nextBatch;
			continue_:;
			}
			for (block = freeList; block;)
				if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)
				{
					//*pblock = (*pblock)->next, freeListSize--;//unlink block
					ablock = &(*ablock = block)->next;
					block = block->next;
					*ablock = NULL;
					if (++additionalBlocksListSize == batchSize)
					{
						abatch = &(*abatch = additionalBlocksList)->nextBatch;
						*abatch = NULL;
						ablock = &additionalBlocksList;
						additionalBlocksList = NULL;
						additionalBlocksListSize = 0;
					}
				}
				else
					block = block->next;
			//Add additional lists
			*abatch = *pbatch;
			*pbatch = additionalBatchesList;
			pblock = ablock;
			freeList = additionalBlocksList;
			freeListSize = additionalBlocksListSize;

			//Return back all left not-for-release blocks to the central cache as quickly as possible (as other threads may want to allocate a new memory)
#define GIVE_LISTS_BACK_TO_CC \
			SPINLOCK_ACQUIRE(&cc->lock);\
			*pbatch = cc->firstBatch;\
			cc->firstBatch = firstBatch;\
			*pblock = cc->freeList;\
			cc->freeList = freeList;\
			cc->freeListSize += freeListSize;\
			SPINLOCK_RELEASE(&cc->lock);\
			if (bufferSize > sizeof(buffer)) LTALLOC_VMFREE(inChunkFreeBlocks, bufferSize);//this better to do before 3. as kernel is likely optimized for release of just allocated range
			GIVE_LISTS_BACK_TO_CC

				if (padsz)
				{
					SPINLOCK_ACQUIRE(&pad.lock);
					if (pad.size < padsz)
					{
						Chunk* first = firstFreeChunk, ** c;
						do//put off free chunks up to a specified pad size
						{
							c = (Chunk**)firstFreeChunk;
							firstFreeChunk = *c;
							pad.size += CHUNK_SIZE;
						} while (pad.size < padsz && firstFreeChunk);
						*c = (Chunk*)pad.freeChunk;
						pad.freeChunk = first;
					}
					SPINLOCK_RELEASE(&pad.lock);
				}

			//3. Return memory to the system
			while (firstFreeChunk)
			{
				Chunk* nextFreeChunk = *(Chunk**)firstFreeChunk;
				LTALLOC_VMFREE(firstFreeChunk, CHUNK_SIZE);
				firstFreeChunk = nextFreeChunk;
			}
		}
		else//nothing to release - just return batches back to the central cache
		{
			GIVE_LISTS_BACK_TO_CC
#undef GIVE_LISTS_BACK_TO_CC
		}}}
	}
}